

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

Type __thiscall
wasm::anon_unknown_20::HeapTypeGeneratorImpl::generateSingleType(HeapTypeGeneratorImpl *this)

{
  uint32_t uVar1;
  BasicType id;
  HeapTypeGeneratorImpl *this_local;
  
  uVar1 = Random::upTo(this->rand,2);
  if (uVar1 == 0) {
    id = generateBasicType(this);
    Type::Type((Type *)&this_local,id);
  }
  else {
    if (uVar1 != 1) {
      ::wasm::handle_unreachable
                ("unexpected",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,0xc5);
    }
    this_local = (HeapTypeGeneratorImpl *)generateRefType(this);
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type generateSingleType() {
    switch (rand.upTo(2)) {
      case 0:
        return generateBasicType();
      case 1:
        return generateRefType();
    }
    WASM_UNREACHABLE("unexpected");
  }